

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

int __thiscall mpt::slice::set(slice *this,convertable *src)

{
  content *pcVar1;
  int iVar2;
  uintptr_t uVar3;
  
  iVar2 = array::set(&this->super_array,src);
  if (-1 < iVar2) {
    this->_off = 0;
    pcVar1 = (this->super_array)._buf._ref;
    if ((pcVar1 == (content *)0x0) || (*(long *)(pcVar1 + 8) != 0)) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(uintptr_t *)(pcVar1 + 0x18);
    }
    this->_len = uVar3;
  }
  return iVar2;
}

Assistant:

int slice::set(convertable &src)
{
	int len = array::set(src);
	if (len < 0) {
		return len;
	}
	_off = 0;
	_len = length();
	return len;
}